

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O1

void __thiscall
ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)2>_>::TestBody
          (ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)2>_> *this)

{
  FP *pFVar1;
  bool bVar2;
  char *pcVar3;
  PositionType minPosition;
  PositionType maxPosition;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  Particle local_50;
  
  minPosition.y = -10.0;
  minPosition.x = -10.0;
  maxPosition.y = 10.0;
  maxPosition.x = 10.0;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
            (&local_50,(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this,minPosition,
             maxPosition);
  local_50.p.x = 1.7489317533889174e-07;
  local_50.p.y = -0.00018756309402915045;
  local_50.p.z = -2.176072126121232e-13;
  local_50.invGamma = 0.9999999824100282;
  (this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
  super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.maxRelativeError
       = 1e-12;
  pFVar1 = &(this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
            super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.
            maxAbsoluteError;
  if (5623002.444493814 < *pFVar1 || *pFVar1 == 5623002.444493814) {
    local_70.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_3e1000007ffffe00;
    testing::internal::CmpHelperLE<double,double>
              (local_60,"dist(newVelocity, particle.getVelocity())","this->maxAbsoluteError",
               (double *)&local_70,
               &(this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
                super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.
                maxAbsoluteError);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_58.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x97,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_70.ptr_ + 8))();
        }
        local_70.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  else {
    local_70.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_3ca7de92225a8e1c;
    testing::internal::CmpHelperLE<double,double>
              (local_60,"dist(newVelocity, particle.getVelocity()) / newVelocity.norm()",
               "this->maxRelativeError",(double *)&local_70,
               &(this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
                super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.
                maxRelativeError);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_58.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x97,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_70.ptr_ + 8))();
        }
        local_70.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetVelocity)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;

    ParticleType particle = this->randomParticle();
    MomentumType newVelocity(5243.1654, -56.23e5, -65.237e-4);
    particle.setVelocity(newVelocity);
    this->maxRelativeError = 1e-12;
    MomentumType v = particle.getVelocity();
    ASSERT_NEAR_VECTOR(newVelocity, particle.getVelocity());
}